

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O0

MPP_RET dec_buf_mgr_init(DecBufMgr *mgr)

{
  DecBufMgr pvVar1;
  MPP_RET local_1c;
  MPP_RET ret;
  DecBufMgrImpl *impl;
  DecBufMgr *mgr_local;
  
  local_1c = MPP_NOK;
  if (mgr != (DecBufMgr *)0x0) {
    pvVar1 = (DecBufMgr)mpp_osal_calloc("dec_buf_mgr_init",0x20);
    if (pvVar1 == (DecBufMgr)0x0) {
      _mpp_log_l(2,"mpi_dec_utils","failed to create decoder buffer manager\n","dec_buf_mgr_init");
    }
    else {
      local_1c = MPP_OK;
    }
    *mgr = pvVar1;
  }
  return local_1c;
}

Assistant:

MPP_RET dec_buf_mgr_init(DecBufMgr *mgr)
{
    DecBufMgrImpl *impl = NULL;
    MPP_RET ret = MPP_NOK;

    if (mgr) {
        impl = mpp_calloc(DecBufMgrImpl, 1);
        if (impl) {
            ret = MPP_OK;
        } else {
            mpp_err_f("failed to create decoder buffer manager\n");
        }

        *mgr = impl;
    }

    return ret;
}